

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool execCommand(QString *program,QStringList *args,QByteArray *output,bool verbose)

{
  FILE *__stream;
  char cVar1;
  int iVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QLatin1String QVar5;
  undefined8 local_98;
  undefined8 uStack_90;
  QByteArray local_88;
  QString *local_68;
  undefined8 local_60;
  char *local_58;
  QArrayData *local_50;
  char *pcStack_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = (QString *)CONCAT62(local_68._2_6_,0x20);
  QtPrivate::QStringList_join((QList *)&local_88,(QChar *)args,(longlong)&local_68);
  __stream = _stdout;
  local_60 = 1;
  local_58 = " ";
  local_50 = &(local_88.d.d)->super_QArrayData;
  pcStack_48 = local_88.d.ptr;
  local_40 = local_88.d.size;
  local_68 = program;
  if (((int)CONCAT71(in_register_00000009,verbose) != 0) && (g_options.verbose == true)) {
    QStringBuilderBase<QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>,_QString>
    ::toUtf8(&local_88,
             (QStringBuilderBase<QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>,_QString>
              *)&local_68);
    pcVar3 = local_88.d.ptr;
    if (local_88.d.ptr == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    fprintf(__stream,"Execute %s.\n",pcVar3);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_98 = 0xaaaaaaaaaaaaaaaa;
  uStack_90 = 0xaaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_98,(QObject *)0x0);
  QProcess::start(&local_98,program,args,3);
  cVar1 = QProcess::waitForStarted((int)&local_98);
  if (cVar1 == '\0') {
    execCommand();
  }
  else {
    QVar5.m_data = (char *)0x3;
    QVar5.m_size = (qsizetype)program;
    QString::endsWith(QVar5,0x1117d4);
    cVar1 = QProcess::waitForFinished((int)&local_98);
    if (cVar1 != '\0') {
      local_88.d.size = -0x5555555555555556;
      local_88.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      QProcess::readAllStandardOutput();
      if (output != (QByteArray *)0x0) {
        QByteArray::append(output);
      }
      if ((verbose) && (g_options.verbose == true)) {
        pcVar3 = local_88.d.ptr;
        if (local_88.d.ptr == (char *)0x0) {
          pcVar3 = (char *)&QByteArray::_empty;
        }
        fprintf(_stdout,"%s\n",pcVar3);
      }
      iVar2 = QProcess::exitCode();
      bVar4 = iVar2 == 0;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0010c8f0;
    }
    execCommand();
  }
  bVar4 = false;
LAB_0010c8f0:
  QProcess::~QProcess((QProcess *)&local_98);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool execCommand(const QString &program, const QStringList &args,
                        QByteArray *output = nullptr, bool verbose = false)
{
    const auto command = program + " "_L1 + args.join(u' ');

    if (verbose && g_options.verbose)
        fprintf(stdout,"Execute %s.\n", command.toUtf8().constData());

    QProcess process;
    process.start(program, args);
    if (!process.waitForStarted()) {
        qCritical("Cannot execute command %s.", qPrintable(command));
        return false;
    }

    // If the command is not adb, for example, make or ninja, it can take more that
    // QProcess::waitForFinished() 30 secs, so for that use a higher timeout.
    const int FinishTimeout = program.endsWith("adb"_L1) ? 30000 : g_options.timeoutSecs * 1000;
    if (!process.waitForFinished(FinishTimeout)) {
        qCritical("Execution of command %s timed out.", qPrintable(command));
        return false;
    }

    const auto stdOut = process.readAllStandardOutput();
    if (output)
        output->append(stdOut);

    if (verbose && g_options.verbose)
        fprintf(stdout, "%s\n", stdOut.constData());

    return process.exitCode() == 0;
}